

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O0

void UpdateMConcatNode(Col_Word node)

{
  byte *list;
  Col_Word list_00;
  Col_Word list_01;
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  size_t sVar4;
  undefined2 local_180;
  byte local_16c;
  undefined2 local_168;
  undefined2 local_150;
  undefined2 local_138;
  undefined2 local_120;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  undefined2 local_f0;
  undefined2 local_d8;
  undefined2 local_c0;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uchar right1Depth;
  uchar right12Depth;
  uchar right11Depth;
  Col_Word right12;
  Col_Word right11;
  Col_Word right2;
  Col_Word right1;
  uchar right2Depth;
  uchar left2Depth_1;
  uchar left22Depth;
  Col_Word CStack_58;
  uchar left21Depth;
  Col_Word left22;
  Col_Word left21;
  Col_Word left2;
  Col_Word left1;
  uchar left2Depth;
  uchar left1Depth;
  size_t sStack_30;
  int pinned;
  size_t leftLength;
  uchar rightDepth;
  byte *pbStack_20;
  uchar leftDepth;
  Col_Word right;
  Col_Word left;
  Col_Word node_local;
  
  right = *(Col_Word *)(node + 0x10);
  left = node;
  leftLength._7_1_ = GetDepth(right);
  pbStack_20 = *(byte **)(left + 0x18);
  leftLength._6_1_ = GetDepth((Col_Word)pbStack_20);
  if (pbStack_20 == (byte *)0x0) {
    local_88 = 0;
  }
  else {
    if (((ulong)pbStack_20 & 0xf) == 0) {
      if ((*pbStack_20 & 2) == 0) {
        local_90 = 0xffffffff;
      }
      else {
        local_90 = *pbStack_20 & 0xfffffffe;
      }
      local_8c = local_90;
    }
    else {
      local_8c = immediateWordTypes[(ulong)pbStack_20 & 0x1f];
    }
    local_88 = local_8c;
  }
  if (local_88 == 0xfffffffa) {
LAB_0011a512:
    left1._4_4_ = *(byte *)left & 1;
    sVar3 = Col_ListLength(right);
    *(undefined1 *)left = 0x26;
    if (leftLength._6_1_ < leftLength._7_1_) {
      local_16c = leftLength._7_1_;
    }
    else {
      local_16c = leftLength._6_1_;
    }
    *(byte *)(left + 1) = local_16c + 1;
    sStack_30 = sVar3;
    sVar4 = Col_ListLength((Col_Word)pbStack_20);
    *(size_t *)(left + 8) = sVar3 + sVar4;
    if (sStack_30 < 0x10000) {
      local_180 = (undefined2)sStack_30;
    }
    else {
      local_180 = 0;
    }
    *(undefined2 *)(left + 2) = local_180;
    *(Col_Word *)(left + 0x10) = right;
    *(byte **)(left + 0x18) = pbStack_20;
    if (left1._4_4_ != 0) {
      *(byte *)left = *(byte *)left | 1;
    }
    return;
  }
  do {
    if (leftLength._6_1_ + 1 < (uint)leftLength._7_1_) {
      if (right == 0) {
        local_94 = 0;
      }
      else {
        if ((right & 0xf) == 0) {
          if ((*(byte *)right & 2) == 0) {
            local_9c = 0xffffffff;
          }
          else {
            local_9c = *(byte *)right & 0xfffffffe;
          }
          local_98 = local_9c;
        }
        else {
          local_98 = immediateWordTypes[right & 0x1f];
        }
        local_94 = local_98;
      }
      if (local_94 != 0x26) {
        ConvertToMConcatNode(&right);
      }
      left2 = *(Col_Word *)(right + 0x10);
      left1._3_1_ = GetDepth(left2);
      left21 = *(Col_Word *)(right + 0x18);
      left1._2_1_ = GetDepth(left21);
      if (left1._3_1_ < left1._2_1_) {
        if (left21 == 0) {
          local_a0 = 0;
        }
        else {
          if ((left21 & 0xf) == 0) {
            if ((*(byte *)left21 & 2) == 0) {
              local_a8 = 0xffffffff;
            }
            else {
              local_a8 = *(byte *)left21 & 0xfffffffe;
            }
            local_a4 = local_a8;
          }
          else {
            local_a4 = immediateWordTypes[left21 & 0x1f];
          }
          local_a0 = local_a4;
        }
        if (local_a0 != 0x26) {
          ConvertToMConcatNode(&left21);
        }
        left22 = *(Col_Word *)(left21 + 0x10);
        CStack_58 = *(Col_Word *)(left21 + 0x18);
        right1._6_1_ = GetDepth(CStack_58);
        right1._7_1_ = GetDepth(left22);
        sVar3 = Col_ListLength(left2);
        bVar1 = right1._7_1_;
        if (right1._7_1_ < left1._3_1_) {
          bVar1 = left1._3_1_;
        }
        leftLength._7_1_ = bVar1 + 1;
        *(undefined1 *)right = 0x26;
        *(byte *)(right + 1) = leftLength._7_1_;
        sStack_30 = sVar3;
        sVar4 = Col_ListLength(left22);
        *(size_t *)(right + 8) = sVar3 + sVar4;
        if (sStack_30 < 0x10000) {
          local_c0 = (undefined2)sStack_30;
        }
        else {
          local_c0 = 0;
        }
        *(undefined2 *)(right + 2) = local_c0;
        *(Col_Word *)(right + 0x10) = left2;
        *(Col_Word *)(right + 0x18) = left22;
        sVar3 = Col_ListLength(CStack_58);
        if (leftLength._6_1_ < right1._6_1_) {
          leftLength._6_1_ = right1._6_1_;
        }
        leftLength._6_1_ = leftLength._6_1_ + 1;
        *(undefined1 *)left21 = 0x26;
        *(byte *)(left21 + 1) = leftLength._6_1_;
        sStack_30 = sVar3;
        sVar4 = Col_ListLength((Col_Word)pbStack_20);
        *(size_t *)(left21 + 8) = sVar3 + sVar4;
        if (sStack_30 < 0x10000) {
          local_d8 = (undefined2)sStack_30;
        }
        else {
          local_d8 = 0;
        }
        *(undefined2 *)(left21 + 2) = local_d8;
        *(Col_Word *)(left21 + 0x10) = CStack_58;
        *(byte **)(left21 + 0x18) = pbStack_20;
        pbStack_20 = (byte *)left21;
      }
      else {
        sStack_30 = Col_ListLength(left21);
        right1._5_1_ = GetDepth(left21);
        sVar3 = sStack_30;
        if (leftLength._6_1_ < right1._5_1_) {
          leftLength._6_1_ = right1._5_1_;
        }
        leftLength._6_1_ = leftLength._6_1_ + 1;
        *(undefined1 *)right = 0x26;
        *(byte *)(right + 1) = leftLength._6_1_;
        sVar4 = Col_ListLength((Col_Word)pbStack_20);
        *(size_t *)(right + 8) = sVar3 + sVar4;
        if (sStack_30 < 0x10000) {
          local_f0 = (undefined2)sStack_30;
        }
        else {
          local_f0 = 0;
        }
        *(undefined2 *)(right + 2) = local_f0;
        *(Col_Word *)(right + 0x10) = left21;
        *(byte **)(right + 0x18) = pbStack_20;
        pbStack_20 = (byte *)right;
        right = left2;
        leftLength._7_1_ = left1._3_1_;
      }
    }
    else {
      if ((uint)leftLength._6_1_ <= leftLength._7_1_ + 1) goto LAB_0011a512;
      if (pbStack_20 == (byte *)0x0) {
        local_f4 = 0;
      }
      else {
        if (((ulong)pbStack_20 & 0xf) == 0) {
          if ((*pbStack_20 & 2) == 0) {
            local_fc = 0xffffffff;
          }
          else {
            local_fc = *pbStack_20 & 0xfffffffe;
          }
          local_f8 = local_fc;
        }
        else {
          local_f8 = immediateWordTypes[(ulong)pbStack_20 & 0x1f];
        }
        local_f4 = local_f8;
      }
      if (local_f4 != 0x26) {
        ConvertToMConcatNode((Col_Word *)&stack0xffffffffffffffe0);
      }
      right2 = *(Col_Word *)(pbStack_20 + 0x10);
      list = *(byte **)(pbStack_20 + 0x18);
      right1._4_1_ = GetDepth((Col_Word)list);
      if ((int)(uint)right1._4_1_ < (int)(leftLength._6_1_ - 1)) {
        if (right2 == 0) {
          local_100 = 0;
        }
        else {
          if ((right2 & 0xf) == 0) {
            if ((*(byte *)right2 & 2) == 0) {
              local_108 = 0xffffffff;
            }
            else {
              local_108 = *(byte *)right2 & 0xfffffffe;
            }
            local_104 = local_108;
          }
          else {
            local_104 = immediateWordTypes[right2 & 0x1f];
          }
          local_100 = local_104;
        }
        if (local_100 != 0x26) {
          ConvertToMConcatNode(&right2);
        }
        list_00 = *(Col_Word *)(right2 + 0x10);
        bVar1 = GetDepth(list_00);
        list_01 = *(Col_Word *)(right2 + 0x18);
        bVar2 = GetDepth(list_01);
        sVar3 = Col_ListLength(right);
        if (bVar1 < leftLength._7_1_) {
          bVar1 = leftLength._7_1_;
        }
        leftLength._7_1_ = bVar1 + 1;
        *(undefined1 *)right2 = 0x26;
        *(byte *)(right2 + 1) = leftLength._7_1_;
        sStack_30 = sVar3;
        sVar4 = Col_ListLength(list_00);
        *(size_t *)(right2 + 8) = sVar3 + sVar4;
        if (sStack_30 < 0x10000) {
          local_120 = (undefined2)sStack_30;
        }
        else {
          local_120 = 0;
        }
        *(undefined2 *)(right2 + 2) = local_120;
        *(Col_Word *)(right2 + 0x10) = right;
        *(Col_Word *)(right2 + 0x18) = list_00;
        right = right2;
        sVar3 = Col_ListLength(list_01);
        bVar1 = right1._4_1_;
        if (right1._4_1_ < bVar2) {
          bVar1 = bVar2;
        }
        leftLength._6_1_ = bVar1 + 1;
        *pbStack_20 = 0x26;
        pbStack_20[1] = leftLength._6_1_;
        sStack_30 = sVar3;
        sVar4 = Col_ListLength((Col_Word)list);
        *(size_t *)(pbStack_20 + 8) = sVar3 + sVar4;
        if (sStack_30 < 0x10000) {
          local_138 = (undefined2)sStack_30;
        }
        else {
          local_138 = 0;
        }
        *(undefined2 *)(pbStack_20 + 2) = local_138;
        *(Col_Word *)(pbStack_20 + 0x10) = list_01;
        *(byte **)(pbStack_20 + 0x18) = list;
      }
      else {
        sStack_30 = Col_ListLength(right);
        bVar1 = GetDepth(right2);
        sVar3 = sStack_30;
        if (bVar1 < leftLength._7_1_) {
          bVar1 = leftLength._7_1_;
        }
        leftLength._7_1_ = bVar1 + 1;
        *pbStack_20 = 0x26;
        pbStack_20[1] = leftLength._6_1_;
        sVar4 = Col_ListLength(right2);
        *(size_t *)(pbStack_20 + 8) = sVar3 + sVar4;
        if (sStack_30 < 0x10000) {
          local_150 = (undefined2)sStack_30;
        }
        else {
          local_150 = 0;
        }
        *(undefined2 *)(pbStack_20 + 2) = local_150;
        *(Col_Word *)(pbStack_20 + 0x10) = right;
        *(Col_Word *)(pbStack_20 + 0x18) = right2;
        right = (Col_Word)pbStack_20;
        leftLength._6_1_ = right1._4_1_;
        pbStack_20 = list;
      }
    }
    sVar3 = Col_ListLength(right);
    *(undefined1 *)left = 0x26;
    bVar1 = leftLength._6_1_;
    if (leftLength._6_1_ < leftLength._7_1_) {
      bVar1 = leftLength._7_1_;
    }
    *(byte *)(left + 1) = bVar1 + 1;
    sStack_30 = sVar3;
    sVar4 = Col_ListLength((Col_Word)pbStack_20);
    *(size_t *)(left + 8) = sVar3 + sVar4;
    if (sStack_30 < 0x10000) {
      local_168 = (undefined2)sStack_30;
    }
    else {
      local_168 = 0;
    }
    *(undefined2 *)(left + 2) = local_168;
    *(Col_Word *)(left + 0x10) = right;
    *(byte **)(left + 0x18) = pbStack_20;
  } while( true );
}

Assistant:

static void
UpdateMConcatNode(
    Col_Word node)  /*!< Mutable concat list node. */
{
    Col_Word left, right;
    unsigned char leftDepth, rightDepth;
    size_t leftLength;
    int pinned;

    ASSERT(WORD_TYPE(node) == WORD_TYPE_MCONCATLIST);

    left = WORD_CONCATLIST_LEFT(node);
    leftDepth = GetDepth(left);
    right = WORD_CONCATLIST_RIGHT(node);
    rightDepth = GetDepth(right);

    if (WORD_TYPE(right) != WORD_TYPE_CIRCLIST) {
        /*
         * Balance tree.
         */

        for (;;) {
            if (leftDepth > rightDepth+1) {
                /*
                 * Left is deeper by more than 1 level, rebalance.
                 */

                unsigned char left1Depth, left2Depth;
                Col_Word left1, left2;

                ASSERT(leftDepth >= 2);
                if (WORD_TYPE(left) != WORD_TYPE_MCONCATLIST) {
                    ConvertToMConcatNode(&left);
                }
                ASSERT(WORD_TYPE(left) == WORD_TYPE_MCONCATLIST);

                left1 = WORD_CONCATLIST_LEFT(left);
                left1Depth = GetDepth(left1);
                left2 = WORD_CONCATLIST_RIGHT(left);
                left2Depth = GetDepth(left2);
                if (left1Depth < left2Depth) {
                    /*
                     * Left2 is deeper, split it between both arms.
                     */

                    Col_Word left21, left22;
                    unsigned char left21Depth, left22Depth;

                    if (WORD_TYPE(left2) != WORD_TYPE_MCONCATLIST) {
                        ConvertToMConcatNode(&left2);
                    }
                    ASSERT(WORD_TYPE(left2) == WORD_TYPE_MCONCATLIST);
                    ASSERT(WORD_CONCATLIST_DEPTH(left2) >= 1);

                    left21 = WORD_CONCATLIST_LEFT(left2);
                    left22 = WORD_CONCATLIST_RIGHT(left2);
                    left22Depth = GetDepth(left22);
                    left21Depth = GetDepth(left21);

                    /*
                     * Update left node.
                     */

                    leftLength = Col_ListLength(left1);
                    leftDepth = (left1Depth>left21Depth?left1Depth:left21Depth)
                            + 1;
                    WORD_MCONCATLIST_INIT(left, leftDepth,
                            leftLength+Col_ListLength(left21), leftLength,
                            left1, left21);

                    /*
                     * Turn left2 into right node.
                     */

                    leftLength = Col_ListLength(left22);
                    rightDepth = (left22Depth>rightDepth?left22Depth:rightDepth)
                            + 1;
                    WORD_MCONCATLIST_INIT(left2, rightDepth,
                        leftLength+Col_ListLength(right), leftLength, left22,
                        right);
                    right = left2;
                } else {
                    /*
                     * Left1 is deeper or at the same level, rotate to right.
                     */

                    unsigned char left2Depth;

                    ASSERT(left1Depth >= 1);

                    /*
                     * Turn left into right node.
                     */

                    leftLength = Col_ListLength(left2);
                    left2Depth = GetDepth(left2);
                    rightDepth = (left2Depth>rightDepth?left2Depth:rightDepth)
                            + 1;
                    WORD_MCONCATLIST_INIT(left, rightDepth,
                            leftLength+Col_ListLength(right), leftLength, left2,
                            right);
                    right = left;

                    /*
                     * Turn left1 into left node.
                     */

                    left = left1;
                    leftDepth = left1Depth;
                }
            } else if (leftDepth+1 < rightDepth) {
                /*
                 * Right is deeper by more than 1 level, rebalance.
                 */

                unsigned char right2Depth;
                Col_Word right1, right2;

                ASSERT(rightDepth >= 2);
                if (WORD_TYPE(right) != WORD_TYPE_MCONCATLIST) {
                    ConvertToMConcatNode(&right);
                }
                ASSERT(WORD_TYPE(right) == WORD_TYPE_MCONCATLIST);

                right1 = WORD_CONCATLIST_LEFT(right);
                right2 = WORD_CONCATLIST_RIGHT(right);
                right2Depth = GetDepth(right2);
                if (right2Depth < rightDepth-1) {
                    /*
                     * Right1 is deeper, split it between both arms.
                     */

                    Col_Word right11, right12;
                    unsigned char right11Depth, right12Depth;

                    if (WORD_TYPE(right1) != WORD_TYPE_MCONCATLIST) {
                        ConvertToMConcatNode(&right1);
                    }
                    ASSERT(WORD_TYPE(right1) == WORD_TYPE_MCONCATLIST);
                    ASSERT(WORD_CONCATLIST_DEPTH(right1) >= 1);

                    right11 = WORD_CONCATLIST_LEFT(right1);
                    right11Depth = GetDepth(right11);
                    right12 = WORD_CONCATLIST_RIGHT(right1);
                    right12Depth = GetDepth(right12);

                    /*
                     * Turn right1 into left node.
                     */

                    leftLength = Col_ListLength(left);
                    leftDepth = (leftDepth>right11Depth?leftDepth:right11Depth)
                            + 1;
                    WORD_MCONCATLIST_INIT(right1, leftDepth,
                            leftLength+Col_ListLength(right11), leftLength,
                            left, right11);
                    left = right1;

                    /*
                     * Update right node.
                     */

                    leftLength = Col_ListLength(right12);
                    rightDepth = (right12Depth>right2Depth?right12Depth:right2Depth)
                            + 1;
                    WORD_MCONCATLIST_INIT(right, rightDepth,
                            leftLength+Col_ListLength(right2), leftLength,
                            right12, right2);
                } else {
                    /*
                     * Right2 is deeper or at the same level, rotate to left.
                     */

                    unsigned char right1Depth;

                    ASSERT(right2Depth >= 1);

                    /*
                     * Turn right into left node.
                     */

                    leftLength = Col_ListLength(left);
                    right1Depth = GetDepth(right1);
                    leftDepth = (leftDepth>right1Depth?leftDepth:right1Depth)
                            + 1;
                    WORD_MCONCATLIST_INIT(right, rightDepth,
                            leftLength+Col_ListLength(right1), leftLength, left,
                            right1);
                    left = right;

                    /*
                     * Turn right2 into right node.
                     */

                    right = right2;
                    rightDepth = right2Depth;
                }
            } else {
                /*
                 * Tree is balanced, stop there.
                 */

                break;
            }

            /*
             * Update node.
             */

            leftLength = Col_ListLength(left);
            WORD_MCONCATLIST_INIT(node,
                    (leftDepth>rightDepth?leftDepth:rightDepth) + 1,
                    leftLength+Col_ListLength(right), leftLength, left, right);
        }
    }

    /*
     * Update node.
     */

    pinned = WORD_PINNED(node);
    leftLength = Col_ListLength(left);
    WORD_MCONCATLIST_INIT(node,
            (leftDepth>rightDepth?leftDepth:rightDepth) + 1,
            leftLength+Col_ListLength(right), leftLength, left, right);
    if (pinned) {
        WORD_SET_PINNED(node);
    }
}